

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::getMemberElementPtr
          (Builder *this,shared_ptr<mocker::ir::Addr> *base,string *className,string *varName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *hint;
  long *plVar2;
  size_t sVar3;
  element_type *peVar4;
  size_type *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string *in_R8;
  shared_ptr<mocker::ir::Reg> sVar7;
  shared_ptr<mocker::ir::IntLiteral> offsetLit;
  shared_ptr<mocker::ir::AttachedComment> attachedComment;
  undefined1 local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  shared_ptr<mocker::ir::IntLiteral> local_98;
  element_type local_88;
  AttachedComment *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  string *local_68;
  shared_ptr<mocker::ir::IRInst> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = className;
  std::operator+(&local_50,"getElementPtr: ",varName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  peVar4 = (element_type *)(plVar2 + 2);
  if ((element_type *)*plVar2 == peVar4) {
    local_88.super_Addr._vptr_Addr = (peVar4->super_Addr)._vptr_Addr;
    local_88.val = plVar2[3];
    local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_88;
  }
  else {
    local_88.super_Addr._vptr_Addr = (peVar4->super_Addr)._vptr_Addr;
    local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar2;
  }
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
  *plVar2 = (long)peVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,(ulong)(in_R8->_M_dataplus)._M_p);
  paVar1 = &local_b8.field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b8.field_2._M_allocated_capacity = *psVar5;
    local_b8.field_2._8_8_ = plVar2[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar5;
    local_b8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78 = (AttachedComment *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::AttachedComment,std::allocator<mocker::ir::AttachedComment>,std::__cxx11::string>
            (&_Stack_70,&local_78,(allocator<mocker::ir::AttachedComment> *)&local_b9,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &local_88) {
    operator_delete(local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_88.super_Addr._vptr_Addr + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_78->super_IRInst;
  local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (AttachedComment *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::appendInst
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,&local_60);
  if (local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  sVar3 = BuilderContext::getOffset
                    ((BuilderContext *)
                     (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi,varName,in_R8);
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_use_count = 1;
  (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_weak_count = 1;
  (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_use_count = (int)sVar3;
  local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_weak_count = (int)(sVar3 >> 0x20);
  hint = (string *)
         (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"varPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)this,hint);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p._0_4_ = 5;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::IntLiteral>&>
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(shared_ptr<mocker::ir::Reg> *)this,(OpType *)&local_b8,
             (shared_ptr<mocker::ir::Addr> *)local_68,&local_98);
  _Var6._M_pi = extraout_RDX;
  if (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar7.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg>
Builder::getMemberElementPtr(const std::shared_ptr<Addr> &base,
                             const std::string &className,
                             const std::string &varName) const {
  auto attachedComment = std::make_shared<AttachedComment>(
      "getElementPtr: " + className + "::" + varName);
  ctx.appendInst(std::move(attachedComment));

  std::size_t offset = ctx.getOffset(className, varName);
  auto offsetLit = std::make_shared<IntLiteral>((Integer)offset);
  auto varPtr = ctx.makeTempLocalReg("varPtr");
  ctx.emplaceInst<ArithBinaryInst>(varPtr, ArithBinaryInst::Add, base,
                                   offsetLit);
  return varPtr;
}